

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::GenericTrack::Copy(GenericTrack *this,GenericTrack *rhs)

{
  undefined8 uVar1;
  ui32_t uVar2;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  uVar2 = rhs->TrackNumber;
  this->TrackID = rhs->TrackID;
  this->TrackNumber = uVar2;
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->TrackName,&rhs->TrackName);
  (this->Sequence).m_property.super_Identifier<16U>.m_HasValue =
       (rhs->Sequence).m_property.super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->Sequence).m_property.super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->Sequence).m_property.super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->Sequence).m_property.super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->Sequence).m_property.super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->Sequence).m_has_value = (rhs->Sequence).m_has_value;
  return;
}

Assistant:

void
GenericTrack::Copy(const GenericTrack& rhs)
{
  InterchangeObject::Copy(rhs);
  TrackID = rhs.TrackID;
  TrackNumber = rhs.TrackNumber;
  TrackName = rhs.TrackName;
  Sequence = rhs.Sequence;
}